

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O2

bool vkt::pipeline::isVertexFormatSfloat(VkFormat format)

{
  return (bool)((byte)(0x249249204081 >> ((byte)(format - VK_FORMAT_R16_SFLOAT) & 0x3f)) &
               format - VK_FORMAT_R16_SFLOAT < 0x2e);
}

Assistant:

bool isVertexFormatSfloat (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_R16_SFLOAT:
		case VK_FORMAT_R16G16_SFLOAT:
		case VK_FORMAT_R32_SFLOAT:
		case VK_FORMAT_R16G16B16_SFLOAT:
		case VK_FORMAT_R16G16B16A16_SFLOAT:
		case VK_FORMAT_R32G32_SFLOAT:
		case VK_FORMAT_R64_SFLOAT:
		case VK_FORMAT_R32G32B32_SFLOAT:
		case VK_FORMAT_R32G32B32A32_SFLOAT:
		case VK_FORMAT_R64G64_SFLOAT:
		case VK_FORMAT_R64G64B64_SFLOAT:
		case VK_FORMAT_R64G64B64A64_SFLOAT:
			return true;

		default:
			break;
	}

	return false;

}